

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capnp.c++
# Opt level: O1

String * __thiscall
capnp::compiler::CompilerMain::getDisplayName
          (String *__return_storage_ptr__,CompilerMain *this,ReadableDirectory *dir,PathPtr path)

{
  char *pcVar1;
  char *pcVar2;
  size_t sVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ArrayPtr<const_char> *params_1;
  bool absolute;
  Fault f;
  String local_68;
  PathPtr local_50;
  ReadableDirectory *local_40;
  char *local_38;
  ArrayPtr<const_char> local_30;
  
  local_50.parts.size_ = path.parts.size_;
  local_50.parts.ptr = path.parts.ptr;
  local_40 = dir;
  kj::
  Table<kj::HashMap<kj::ReadableDirectory_const*,kj::String>::Entry,kj::HashIndex<kj::HashMap<kj::ReadableDirectory_const*,kj::String>::Callbacks>>
  ::find<0ul,kj::ReadableDirectory_const*&>
            ((Table<kj::HashMap<kj::ReadableDirectory_const*,kj::String>::Entry,kj::HashIndex<kj::HashMap<kj::ReadableDirectory_const*,kj::String>::Callbacks>>
              *)&local_68,(ReadableDirectory **)&this->dirPrefixes);
  pcVar2 = local_68.content.ptr;
  if ((ArrayPtr<const_char> *)local_68.content.ptr == (ArrayPtr<const_char> *)0x0) {
    iVar4 = (**((this->disk).ptr)->_vptr_Filesystem)();
    if ((ReadableDirectory *)CONCAT44(extraout_var,iVar4) == dir) {
      absolute = true;
    }
    else {
      iVar4 = (*((this->disk).ptr)->_vptr_Filesystem[1])();
      if ((ReadableDirectory *)CONCAT44(extraout_var_00,iVar4) != dir) {
        kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[23]>
                  ((Fault *)&local_68,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compiler/capnp.c++"
                   ,0x7e7,FAILED,(char *)0x0,"\"unrecognized directory\"",
                   (char (*) [23])"unrecognized directory");
        kj::_::Debug::Fault::fatal((Fault *)&local_68);
      }
      absolute = false;
    }
    kj::PathPtr::toString(__return_storage_ptr__,&local_50,absolute);
  }
  else {
    kj::PathPtr::toString(&local_68,&local_50,false);
    pcVar1 = ((ArrayPtr<const_char> *)((long)pcVar2 + 0x10))->ptr;
    local_40 = (ReadableDirectory *)pcVar1;
    if (pcVar1 != (char *)0x0) {
      local_40 = *(ReadableDirectory **)((long)pcVar2 + 8);
    }
    local_38 = pcVar1 + -1;
    if (pcVar1 == (char *)0x0) {
      local_38 = (char *)0x0;
    }
    params_1 = (ArrayPtr<const_char> *)local_68.content.size_;
    if ((ArrayPtr<const_char> *)local_68.content.size_ != (ArrayPtr<const_char> *)0x0) {
      params_1 = (ArrayPtr<const_char> *)local_68.content.ptr;
    }
    local_30.size_ =
         (size_t)((long)&((ArrayPtr<const_char> *)(local_68.content.size_ + -0x10))->size_ + 7);
    if ((ArrayPtr<const_char> *)local_68.content.size_ == (ArrayPtr<const_char> *)0x0) {
      local_30.size_ = (size_t)(char *)0x0;
    }
    kj::_::concat<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
              (__return_storage_ptr__,(_ *)&local_40,&local_30,params_1);
    sVar3 = local_68.content.size_;
    pcVar2 = local_68.content.ptr;
    if ((ArrayPtr<const_char> *)local_68.content.ptr != (ArrayPtr<const_char> *)0x0) {
      local_68.content.ptr = (char *)0x0;
      local_68.content.size_ = 0;
      (**(local_68.content.disposer)->_vptr_ArrayDisposer)
                (local_68.content.disposer,pcVar2,1,sVar3,sVar3,0);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

kj::String getDisplayName(const kj::ReadableDirectory& dir, kj::PathPtr path) {
    KJ_IF_SOME(prefix, dirPrefixes.find(&dir)) {
      return kj::str(prefix, path.toNativeString());
    } else if (&dir == &disk->getRoot()) {
      return path.toNativeString(true);
    } else if (&dir == &disk->getCurrent()) {
      return path.toNativeString(false);
    } else {
      KJ_FAIL_ASSERT("unrecognized directory");
    }
  }
};

}